

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::XmlReporter::StartTestCase(XmlReporter *this,TestCaseInfo *testInfo)

{
  XmlWriter *this_00;
  allocator<char> local_5a;
  allocator<char> local_59;
  string local_58;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"TestCase",&local_59);
  this_00 = XmlWriter::startElement(&this->m_xml,&local_38);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"name",&local_5a);
  XmlWriter::writeAttribute(this_00,&local_58,&testInfo->m_name);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  this->m_currentTestSuccess = true;
  return;
}

Assistant:

virtual void StartTestCase( const Catch::TestCaseInfo& testInfo ) {
            m_xml.startElement( "TestCase" ).writeAttribute( "name", testInfo.getName() );
            m_currentTestSuccess = true;
        }